

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

string * __thiscall
pbrt::HomogeneousMedium::ToString_abi_cxx11_(string *__return_storage_ptr__,HomogeneousMedium *this)

{
  HGPhaseFunction *unaff_RBX;
  
  StringPrintf<pbrt::DenselySampledSpectrum_const&,pbrt::DenselySampledSpectrum_const&,pbrt::DenselySampledSpectrum_const&,pbrt::HGPhaseFunction_const&>
            (__return_storage_ptr__,
             (pbrt *)"[ Homogeneous medium sigma_a_spec: %s sigma_s_spec: %s Le_spec: phase: %s ]",
             (char *)this,&this->sigma_s_spec,&this->Le_spec,(DenselySampledSpectrum *)&this->phase,
             unaff_RBX);
  return __return_storage_ptr__;
}

Assistant:

std::string HomogeneousMedium::ToString() const {
    return StringPrintf(
        "[ Homogeneous medium sigma_a_spec: %s sigma_s_spec: %s Le_spec: phase: %s ]",
        sigma_a_spec, sigma_s_spec, Le_spec, phase);
}